

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O1

void TPZShapeH1<pzshape::TPZShapeQuad>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  TPZTransform<double> *this;
  ulong uVar4;
  int nod;
  long lVar5;
  ulong uVar6;
  int d_1;
  long lVar7;
  int d;
  int side;
  long lVar8;
  int xj;
  long lVar9;
  TPZFNMatrix<1,_double> auxmat;
  TPZFNMatrix<18,_double> phiblend;
  TPZFNMatrix<18,_double> dphiblend;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> phin;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphiaux2;
  ulong local_12e0;
  long local_12b0;
  TPZFMatrix<double> local_1238;
  double adStack_11a8 [2];
  TPZFMatrix<double> local_1198;
  double local_1108 [19];
  TPZFMatrix<double> local_1070;
  double local_fe0 [19];
  TPZManVector<double,_3> local_f48;
  TPZFMatrix<double> local_f10;
  double adStack_e80 [101];
  TPZFMatrix<double> local_b58;
  double local_ac8 [101];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  pzshape::TPZShapeQuad::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 4) {
    local_1198.fElem = local_1108;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 9;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018add20;
    local_1198.fSize = 0x12;
    local_1198.fGiven = local_1198.fElem;
    TPZVec<int>::TPZVec(&local_1198.fPivot.super_TPZVec<int>,0);
    local_1198.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_1198.fPivot.super_TPZVec<int>.fStore = local_1198.fPivot.fExtAlloc;
    local_1198.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1198.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1198.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_1198.fWork.fStore = (double *)0x0;
    local_1198.fWork.fNElements = 0;
    local_1198.fWork.fNAlloc = 0;
    local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018ada30;
    local_1070.fElem = local_fe0;
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 9;
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018add20;
    local_1070.fSize = 0x12;
    local_1070.fGiven = local_1070.fElem;
    TPZVec<int>::TPZVec(&local_1070.fPivot.super_TPZVec<int>,0);
    local_1070.fPivot.super_TPZVec<int>.fStore = local_1070.fPivot.fExtAlloc;
    local_1070.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_1070.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1070.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1070.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_1070.fWork.fStore = (double *)0x0;
    local_1070.fWork.fNElements = 0;
    local_1070.fWork.fNAlloc = 0;
    local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018ada30;
    lVar7 = 0;
    lVar5 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar5) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
         (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1198.fElem[lVar5] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar5];
      lVar8 = 0;
      do {
        if (((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar8) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_1070.fElem +
         lVar8 * 8 + local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7) =
             *(undefined8 *)
              ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
              lVar8 * 8 +
              (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow * lVar7);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 != 4);
    pzshape::TPZShapeQuad::ShapeGenerating(pt,&local_1198,&local_1070);
    local_12e0 = 4;
    lVar5 = 4;
    local_12b0 = 0x20;
    do {
      side = (int)lVar5;
      uVar1 = pzshape::TPZShapeQuad::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -4]);
      if (uVar1 != 0) {
        if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(int)local_12e0;
        if ((((int)local_12e0 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar7)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7] = local_1198.fElem[lVar5];
        lVar8 = 0;
        do {
          if ((local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
             (local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow <= lVar8) || ((int)local_12e0 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem
          [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
           lVar7 + lVar8] =
               *(double *)
                ((long)local_1070.fElem +
                lVar8 * 8 + local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_12b0
                );
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        uVar2 = (int)local_12e0 + 1;
        local_12e0 = (ulong)uVar2;
        if (uVar1 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar5 + -4;
          iVar3 = pztopology::TPZQuadrilateral::SideDimension(side);
          lVar7 = (long)(int)uVar1;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_f10.fSize = 100;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
          local_f10.fElem = adStack_e80;
          local_f10.fGiven = adStack_e80;
          TPZVec<int>::TPZVec(&local_f10.fPivot.super_TPZVec<int>,0);
          local_f10.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_f10.fPivot.super_TPZVec<int>.fStore = local_f10.fPivot.fExtAlloc;
          local_f10.fPivot.super_TPZVec<int>.fNElements = 0;
          local_f10.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_f10.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_f10.fWork.fStore = (double *)0x0;
          local_f10.fWork.fNElements = 0;
          local_f10.fWork.fNAlloc = 0;
          if (100 < (int)uVar1) {
            local_f10.fElem = (double *)operator_new__(lVar7 * 8);
          }
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          lVar8 = (long)iVar3;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_b58.fSize = 100;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_b58.fElem = local_ac8;
          local_b58.fGiven = local_ac8;
          TPZVec<int>::TPZVec(&local_b58.fPivot.super_TPZVec<int>,0);
          local_b58.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_b58.fPivot.super_TPZVec<int>.fStore = local_b58.fPivot.fExtAlloc;
          local_b58.fPivot.super_TPZVec<int>.fNElements = 0;
          local_b58.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_b58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_b58.fWork.fStore = (double *)0x0;
          local_b58.fWork.fNElements = 0;
          local_b58.fWork.fNAlloc = 0;
          if (iVar3 == 0) {
            local_b58.fElem = (double *)0x0;
          }
          else {
            uVar4 = lVar8 * lVar7;
            if (100 < (long)uVar4) {
              uVar6 = uVar4 * 8;
              if (0x1fffffffffffffff < uVar4) {
                uVar6 = 0xffffffffffffffff;
              }
              local_b58.fElem = (double *)operator_new__(uVar6);
            }
          }
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_7a0.fSize = 100;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_7a0.fElem = local_710;
          local_7a0.fGiven = local_710;
          TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
          local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
          local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_7a0.fWork.fStore = (double *)0x0;
          local_7a0.fWork.fNElements = 0;
          local_7a0.fWork.fNAlloc = 0;
          if (0x32 < (int)uVar1) {
            uVar4 = lVar7 << 4;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 2)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_7a0.fElem = (double *)operator_new__(uVar4);
          }
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0185f360;
          local_3e8.fSize = 100;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
          local_3e8.fElem = local_358;
          local_3e8.fGiven = local_358;
          TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
          local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
          local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_3e8.fWork.fStore = (double *)0x0;
          local_3e8.fWork.fNElements = 0;
          local_3e8.fWork.fNAlloc = 0;
          if (0x32 < (int)uVar1) {
            uVar4 = lVar7 << 4;
            if (0x1fffffffffffffff < (ulong)(lVar7 * 2)) {
              uVar4 = 0xffffffffffffffff;
            }
            local_3e8.fElem = (double *)operator_new__(uVar4);
          }
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_0185f070;
          TPZManVector<double,_3>::TPZManVector(&local_f48,lVar8);
          TPZTransform<double>::Apply(this,pt,&local_f48.super_TPZVec<double>);
          pzshape::TPZShapeQuad::ShapeInternal
                    (side,&local_f48.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar5 + -4],&local_f10,
                     &local_b58);
          if (iVar3 < 3) {
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018e21e8;
            local_1238.fSize = 1;
            local_1238.fElem = adStack_11a8;
            local_1238.fGiven = adStack_11a8;
            TPZVec<int>::TPZVec(&local_1238.fPivot.super_TPZVec<int>,0);
            local_1238.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_1238.fPivot.super_TPZVec<int>.fStore = local_1238.fPivot.fExtAlloc;
            local_1238.fPivot.super_TPZVec<int>.fNElements = 0;
            local_1238.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_1238.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            local_1238.fWork.fStore = (double *)0x0;
            local_1238.fWork.fNElements = 0;
            local_1238.fWork.fNAlloc = 0;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018e1ef8;
            TPZFMatrix<double>::operator=(&local_1238,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_b58,&local_1238,&local_7a0,1);
            if (1 < (int)uVar1) {
              local_12e0 = (ulong)(int)uVar2;
              lVar7 = local_12e0 * 8;
              uVar4 = 1;
              lVar8 = 8;
              do {
                if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)local_12e0 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)local_12e0)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[local_12e0] =
                     local_1198.fElem[lVar5] * local_f10.fElem[uVar4];
                lVar9 = 0;
                do {
                  if ((local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                     (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                     (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_12e0 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)local_12e0)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  *(double *)
                   ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                   lVar9 * 8 +
                   (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow * lVar7) =
                       *(double *)
                        ((long)local_1070.fElem +
                        lVar9 * 8 +
                        local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_12b0) *
                       local_f10.fElem[uVar4] +
                       local_1198.fElem[lVar5] *
                       *(double *)
                        ((long)local_7a0.fElem +
                        lVar9 * 8 +
                        local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 == 1);
                local_12e0 = local_12e0 + 1;
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 8;
                lVar8 = lVar8 + 8;
              } while (uVar4 != uVar1);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_1238,&PTR_PTR_018e21b0);
          }
          else if (1 < (int)uVar1) {
            local_12e0 = (ulong)(int)uVar2;
            lVar7 = local_12e0 * 8;
            uVar4 = 1;
            lVar8 = 8;
            do {
              if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                 (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                 (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)local_12e0 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)local_12e0)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[local_12e0] =
                   local_1198.fElem[lVar5] * local_f10.fElem[uVar4];
              lVar9 = 0;
              do {
                if ((local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
                   (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar5) ||
                   (local_1198.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar4)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow <= lVar9) || ((long)local_12e0 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)local_12e0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(data->fDPhi).super_TPZFMatrix<double>.fElem +
                 lVar9 * 8 +
                 (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar7) =
                     *(double *)
                      ((long)local_1070.fElem +
                      lVar9 * 8 +
                      local_1070.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_12b0) *
                     local_f10.fElem[uVar4] +
                     local_1198.fElem[lVar5] *
                     *(double *)
                      ((long)local_b58.fElem +
                      lVar9 * 8 + local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8
                      );
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              local_12e0 = local_12e0 + 1;
              uVar4 = uVar4 + 1;
              lVar7 = lVar7 + 8;
              lVar8 = lVar8 + 8;
            } while (uVar4 != uVar1);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_f48);
          TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_b58,&PTR_PTR_0185f328);
          TPZFMatrix<double>::~TPZFMatrix(&local_f10,&PTR_PTR_0185f328);
        }
      }
      lVar5 = lVar5 + 1;
      local_12b0 = local_12b0 + 8;
    } while (lVar5 != 9);
    TPZFMatrix<double>::~TPZFMatrix(&local_1070,&PTR_PTR_018adce8);
    TPZFMatrix<double>::~TPZFMatrix(&local_1198,&PTR_PTR_018adce8);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}